

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<Elf64_auxv_t,_char> *a)

{
  JObject *this;
  ostream *poVar1;
  char local_5f [54];
  char local_29;
  undefined1 local_28 [8];
  JObject writer;
  JSON<Elf64_auxv_t,_char> *a_local;
  ostream *os_local;
  
  writer.sep = (char *)a;
  JObject::JObject((JObject *)local_28,os);
  switch(**(undefined8 **)writer.sep) {
  case 0:
    local_29 = '\0';
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_NULL",&local_29);
    break;
  case 1:
    local_5f[0x22] = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_IGNORE",local_5f + 0x22
              );
    break;
  case 2:
    local_5f[0x21] = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_EXECFD",local_5f + 0x21
              );
    break;
  case 3:
    local_5f[0x20] = 0;
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_PHDR",local_5f + 0x20);
    break;
  case 4:
    local_5f[0x1f] = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_PHENT",local_5f + 0x1f);
    break;
  case 5:
    local_5f[0x1e] = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_PHNUM",local_5f + 0x1e);
    break;
  case 6:
    local_5f[0x1d] = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_PAGESZ",local_5f + 0x1d
              );
    break;
  case 7:
    local_5f[0x1c] = 0;
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_BASE",local_5f + 0x1c);
    break;
  case 8:
    local_5f[0x1b] = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_FLAGS",local_5f + 0x1b);
    break;
  case 9:
    local_5f[0x1a] = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_ENTRY",local_5f + 0x1a);
    break;
  case 10:
    local_5f[0x19] = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_NOTELF",local_5f + 0x19
              );
    break;
  case 0xb:
    local_5f[0x18] = 0;
    JObject::field<char[7],char[7],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [7])"AT_UID",local_5f + 0x18);
    break;
  case 0xc:
    local_5f[0x17] = 0;
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_EUID",local_5f + 0x17);
    break;
  case 0xd:
    local_5f[0x16] = 0;
    JObject::field<char[7],char[7],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [7])"AT_GID",local_5f + 0x16);
    break;
  case 0xe:
    local_5f[0x15] = 0;
    JObject::field<char[7],char[8],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [8])"AT_EGID",local_5f + 0x15);
    break;
  case 0xf:
    local_5f[0x14] = 0;
    JObject::field<char[7],char[12],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [12])"AT_PLATFORM",
               local_5f + 0x14);
    break;
  case 0x10:
    local_5f[0x13] = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_HWCAP",local_5f + 0x13);
    break;
  case 0x11:
    local_5f[0x12] = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_CLKTCK",local_5f + 0x12
              );
    break;
  case 0x12:
    local_5f[0x11] = 0;
    JObject::field<char[7],char[9],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [9])"AT_FPUCW",local_5f + 0x11);
    break;
  case 0x13:
    local_5f[0x10] = 0;
    JObject::field<char[7],char[15],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [15])"AT_DCACHEBSIZE",
               local_5f + 0x10);
    break;
  case 0x14:
    local_5f[0xf] = 0;
    JObject::field<char[7],char[15],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [15])"AT_ICACHEBSIZE",
               local_5f + 0xf);
    break;
  case 0x15:
    local_5f[0xe] = 0;
    JObject::field<char[7],char[15],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [15])"AT_UCACHEBSIZE",
               local_5f + 0xe);
    break;
  case 0x16:
    local_5f[0xd] = 0;
    JObject::field<char[7],char[13],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [13])"AT_IGNOREPPC",
               local_5f + 0xd);
    break;
  case 0x17:
    local_5f[0xc] = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_SECURE",local_5f + 0xc)
    ;
    break;
  case 0x18:
    local_5f[0xb] = 0;
    JObject::field<char[7],char[17],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [17])"AT_BASE_PLATFORM",
               local_5f + 0xb);
    break;
  case 0x19:
    local_5f[10] = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_RANDOM",local_5f + 10);
    break;
  case 0x1a:
    local_5f[9] = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_HWCAP2",local_5f + 9);
    break;
  default:
    local_5f[1] = 0;
    JObject::field<char[7],unsigned_long,char>
              ((JObject *)local_28,(char (*) [7])"a_type",*(unsigned_long **)writer.sep,local_5f + 1
              );
    break;
  case 0x1f:
    local_5f[8] = 0;
    JObject::field<char[7],char[10],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [10])"AT_EXECFN",local_5f + 8);
    break;
  case 0x20:
    local_5f[7] = 0;
    JObject::field<char[7],char[11],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [11])"AT_SYSINFO",local_5f + 7);
    break;
  case 0x21:
    local_5f[6] = 0;
    JObject::field<char[7],char[16],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [16])"AT_SYSINFO_EHDR",
               local_5f + 6);
    break;
  case 0x22:
    local_5f[5] = 0;
    JObject::field<char[7],char[18],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [18])"AT_L1I_CACHESHAPE",
               local_5f + 5);
    break;
  case 0x23:
    local_5f[4] = 0;
    JObject::field<char[7],char[18],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [18])"AT_L1D_CACHESHAPE",
               local_5f + 4);
    break;
  case 0x24:
    local_5f[3] = 0;
    JObject::field<char[7],char[17],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [17])"AT_L2_CACHESHAPE",
               local_5f + 3);
    break;
  case 0x25:
    local_5f[2] = 0;
    JObject::field<char[7],char[17],char>
              ((JObject *)local_28,(char (*) [7])"a_type",(char (*) [17])"AT_L3_CACHESHAPE",
               local_5f + 2);
  }
  local_5f[0] = '\0';
  this = JObject::field<char[6],unsigned_long,char>
                   ((JObject *)local_28,(char (*) [6])"a_val",
                    (unsigned_long *)(*(long *)writer.sep + 8),local_5f);
  poVar1 = JObject::operator_cast_to_ostream_(this);
  JObject::~JObject((JObject *)local_28);
  return poVar1;
}

Assistant:

std::ostream &
operator <<(std::ostream &os, const JSON<Elf::auxv_t> &a)
{
    JObject writer(os);

    switch (a.object.a_type) {
#define AUX_TYPE(name, value) case value: writer.field("a_type", #name); break;
#include "libpstack/elf/auxv.h"
    default: writer.field("a_type", a.object.a_type); break;
#undef AUX_TYPE
    }
    return writer.field("a_val", a.object.a_un.a_val);
}